

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketsOps.cpp
# Opt level: O0

int mario::sockets::getSocketError(int sockfd)

{
  int iVar1;
  int *piVar2;
  socklen_t local_18;
  int local_14;
  socklen_t optlen;
  int optVal;
  int sockfd_local;
  
  local_18 = 4;
  optlen = sockfd;
  iVar1 = getsockopt(sockfd,1,4,&local_14,&local_18);
  if (iVar1 < 0) {
    piVar2 = __errno_location();
    optVal = *piVar2;
  }
  else {
    optVal = local_14;
  }
  return optVal;
}

Assistant:

int sockets::getSocketError(int sockfd) {
    int optVal;
    socklen_t optlen = sizeof(optVal);

    if (::getsockopt(sockfd, SOL_SOCKET, SO_ERROR, &optVal, &optlen) < 0) {
        return errno;
    } else {
        return optVal;
    }
}